

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cxx
# Opt level: O2

void __thiscall Matrix::Matrix(Matrix *this,int dimensions,int *sizes)

{
  int *piVar1;
  long lVar2;
  ulong uVar3;
  allocator<char> local_21;
  
  Physical::Physical(&this->super_Physical);
  (this->super_Physical)._vptr_Physical = (_func_int **)&PTR__Matrix_00155750;
  (this->matrixParent).px = (double *)0x0;
  (this->matrixParent).pn.pi_ = (sp_counted_base *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->sMatrixName,"data",&local_21);
  this->nMatrixDimension = dimensions;
  uVar3 = 0xffffffffffffffff;
  if (-1 < dimensions) {
    uVar3 = (ulong)(uint)dimensions << 2;
  }
  piVar1 = (int *)operator_new__(uVar3);
  this->pSize = piVar1;
  for (lVar2 = 0; lVar2 < dimensions; lVar2 = lVar2 + 1) {
    piVar1[lVar2] = sizes[lVar2];
  }
  this->bReference = false;
  init(this,(EVP_PKEY_CTX *)0x1);
  return;
}

Assistant:

Matrix::Matrix(int dimensions, int* sizes) : sMatrixName("data") 
 { 
	nMatrixDimension = dimensions;
	pSize = new int[nMatrixDimension];
	for(int i=0; i<nMatrixDimension; i++)
		pSize[i] = sizes[i];
	bReference = false;
	init();
}